

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::SimpleDescriptorDatabaseExtraTest_FindAllPackageNames_Test::
TestBody(SimpleDescriptorDatabaseExtraTest_FindAllPackageNames_Test *this)

{
  bool bVar1;
  void *pvVar2;
  Arena *pAVar3;
  pointer *__ptr;
  char *in_R9;
  char *message;
  pointer *__ptr_2;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  packages;
  SimpleDescriptorDatabase db;
  FileDescriptorProto b;
  FileDescriptorProto f;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  AssertHelper local_2b0;
  undefined1 local_2a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  SimpleDescriptorDatabase local_270;
  undefined1 local_208 [200];
  ArenaStringPtr local_140;
  ArenaStringPtr local_138 [5];
  undefined1 local_110 [200];
  ArenaStringPtr local_48;
  ArenaStringPtr local_40 [5];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_110,(Arena *)0x0);
  local_110[0x10] = local_110[0x10] | 1;
  pAVar3 = (Arena *)local_110._8_8_;
  if ((local_110._8_8_ & 1) != 0) {
    pAVar3 = *(Arena **)(local_110._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set(&local_48,value,pAVar3);
  local_110[0x10] = local_110[0x10] | 2;
  if ((local_110._8_8_ & 1) != 0) {
    local_110._8_8_ = *(undefined8 *)(local_110._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "foo";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(local_40,value_00,(Arena *)local_110._8_8_);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_110 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pAVar3 = *(Arena **)((long)pvVar2 + 8);
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  value_01._M_str = "Foo";
  value_01._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar2 + 0xd8),value_01,pAVar3);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_208,(Arena *)0x0);
  local_208[0x10] = local_208[0x10] | 1;
  pAVar3 = (Arena *)local_208._8_8_;
  if ((local_208._8_8_ & 1) != 0) {
    pAVar3 = *(Arena **)(local_208._8_8_ & 0xfffffffffffffffe);
  }
  value_02._M_str = "bar.proto";
  value_02._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set(&local_140,value_02,pAVar3);
  local_208[0x10] = local_208[0x10] | 2;
  if ((local_208._8_8_ & 1) != 0) {
    local_208._8_8_ = *(undefined8 *)(local_208._8_8_ & 0xfffffffffffffffe);
  }
  message = anon_var_dwarf_a12c75 + 5;
  protobuf::internal::ArenaStringPtr::Set
            (local_138,(string_view)(ZEXT816(0x1141ae9) << 0x40),(Arena *)local_208._8_8_);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_208 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pAVar3 = *(Arena **)((long)pvVar2 + 8);
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  value_03._M_str = "Bar";
  value_03._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar2 + 0xd8),value_03,pAVar3);
  SimpleDescriptorDatabase::SimpleDescriptorDatabase(&local_270);
  SimpleDescriptorDatabase::Add(&local_270,(FileDescriptorProto *)local_110);
  SimpleDescriptorDatabase::Add(&local_270,(FileDescriptorProto *)local_208);
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = DescriptorDatabase::FindAllPackageNames(&local_270.super_DescriptorDatabase,&local_288);
  local_2c0._M_head_impl._0_1_ = bVar1;
  local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a8,(internal *)&local_2c0,
               (AssertionResult *)"db.FindAllPackageNames(&packages)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x20a,(char *)CONCAT71(local_2a8._1_7_,local_2a8[0]));
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2a8._1_7_,local_2a8[0]) != &local_298) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2a8._1_7_,local_2a8[0]),local_298._M_allocated_capacity + 1)
      ;
    }
    if (local_2c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2c8._M_head_impl + 8))();
    }
  }
  if (local_2b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2b8,local_2b8);
  }
  local_2c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (anon_var_dwarf_a12c75 + 5);
  local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11364a4;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(local_2a8,(char *)&local_2c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"packages");
  if (local_2a8[0] == '\0') {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (local_2a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x20b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if (local_2c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2c0._M_head_impl + 8))();
    }
  }
  if (local_2a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2a0,local_2a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase(&local_270);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_208);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_110);
  return;
}

Assistant:

TEST(SimpleDescriptorDatabaseExtraTest, FindAllPackageNames) {
  FileDescriptorProto f;
  f.set_name("foo.proto");
  f.set_package("foo");
  f.add_message_type()->set_name("Foo");

  FileDescriptorProto b;
  b.set_name("bar.proto");
  b.set_package("");
  b.add_message_type()->set_name("Bar");

  SimpleDescriptorDatabase db;
  db.Add(f);
  db.Add(b);

  std::vector<std::string> packages;
  EXPECT_TRUE(db.FindAllPackageNames(&packages));
  EXPECT_THAT(packages, ::testing::UnorderedElementsAre("foo", ""));
}